

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnTriangle
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  ChGaussPoint *this_00;
  ChLog *this_01;
  ChStreamOutAscii *this_02;
  ChVector<double> local_38;
  
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints == 1) {
    local_38.m_data[2] = 0.0;
    local_38.m_data[0] = 0.0;
    local_38.m_data[1] = 0.0;
    this_00 = (ChGaussPoint *)::operator_new(0xa0);
    ChGaussPoint::ChGaussPoint(this_00,1,&local_38,4.0);
    *(GpVector->
     super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>).
     _M_impl.super__Vector_impl_data._M_start = this_00;
    return;
  }
  this_01 = GetLog();
  this_02 = ChStreamOutAscii::operator<<
                      (&this_01->super_ChStreamOutAscii,
                       "SetIntOnCube: unsupported number of integration points: ");
  ChStreamOutAscii::operator<<(this_02,nPoints);
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnTriangle(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            coord.z() = 0.0;
            weight = 4.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        //  case 4:

        // c.resize(2);
        // w.resize(2);
        //      c[0] = -0.577350269189626;
        //      c[1] =  0.577350269189626;

        //      w[0] = 1.0;
        //      w[1] = 1.0;

        //      for ( i = 0; i < 2; i++ ) {
        //          for ( j = 0; j < 2; j++ ) {
        //                  coord.x() = c[ i ];
        //			coord.y() = c[ j ];
        //                  weight = w[ i ] * w[ j ];
        //			//ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
        //                  ( * GpVector ) [ 2 * i + j ] = new ChGaussPoint( 2 * i + j + 1 , &coord, weight);
        //          }
        //      }

        // break;

        //  case 9:

        // c.resize(3);
        // w.resize(3);
        //      c[0] = -0.774596669241483;
        //      c[1] =  0.0;
        //      c[2] =  0.774596669241483;

        //      w[0] =  0.555555555555555;
        //      w[1] =  0.888888888888888;
        //      w[2] =  0.555555555555555;

        //      for ( i = 0; i < 3; i++ ) {
        //          for ( j = 0; j < 3; j++ ) {
        //                  coord.x() = c[ i ];
        //			coord.y() = c[ j ];
        //                  weight = w[ i ] * w[ j ];
        //                  ( * GpVector ) [ 3 * i + j ] = new ChGaussPoint( 3 * i + j + 1, &coord, weight);
        //          }
        //      }

        //      break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}